

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  abctime aVar2;
  int *__ptr;
  abctime aVar3;
  char *pcVar4;
  int *pSimInfo;
  abctime clk;
  int RetValue;
  int c;
  Prove_Params_t *pParams;
  Prove_Params_t Params;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Prove_ParamsSetDefault((Prove_Params_t *)&pParams);
  Extra_UtilGetoptReset();
LAB_00291c24:
  iVar1 = Extra_UtilGetopt(argc,argv,"NCFGLIrfbvh");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      return 1;
    }
    iVar1 = Abc_NtkLatchNum(pNtk_00);
    if (0 < iVar1) {
      Abc_Print(-1,"Currently can only solve the miter for combinational circuits.\n");
      return 0;
    }
    iVar1 = Abc_NtkCoNum(pNtk_00);
    if (iVar1 != 1) {
      Abc_Print(-1,"Currently can only solve the miter with one output.\n");
      return 0;
    }
    aVar2 = Abc_Clock();
    iVar1 = Abc_NtkIsStrash(pNtk_00);
    if (iVar1 == 0) {
      Params.nTotalInspectsMade = (ABC_INT64_T)Abc_NtkStrash(pNtk_00,0,0,0);
    }
    else {
      Params.nTotalInspectsMade = (ABC_INT64_T)Abc_NtkDup(pNtk_00);
    }
    iVar1 = Abc_NtkMiterProve((Abc_Ntk_t **)&Params.nTotalInspectsMade,(Prove_Params_t *)&pParams);
    if (iVar1 == 0) {
      __ptr = Abc_NtkVerifySimulatePattern(pNtk_00,*(int **)(Params.nTotalInspectsMade + 0x130));
      if (*__ptr != 1) {
        Abc_Print(1,"ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
    }
    pAbc->Status = iVar1;
    if (iVar1 == -1) {
      Abc_Print(1,"UNDECIDED      ");
    }
    else if (iVar1 == 0) {
      Abc_Print(1,"SATISFIABLE    ");
    }
    else {
      Abc_Print(1,"UNSATISFIABLE  ");
    }
    aVar3 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar3 - aVar2);
    Abc_FrameReplaceCurrentNetwork(pAbc,(Abc_Ntk_t *)Params.nTotalInspectsMade);
    return 0;
  }
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      goto LAB_00292166;
    }
    Params.fVerbose = atoi(argv[globalUtilOptind]);
    iVar1 = Params.fVerbose;
    break;
  default:
    goto LAB_00292166;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_00292166;
    }
    Params.nRewritingLimitStart = atoi(argv[globalUtilOptind]);
    iVar1 = Params.nRewritingLimitStart;
    break;
  case 0x47:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
      goto LAB_00292166;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Params.nRewritingLimitMulti = (float)iVar1;
    globalUtilOptind = globalUtilOptind + 1;
    if (Params.nRewritingLimitMulti < 0.0) goto LAB_00292166;
    goto LAB_00291c24;
  case 0x49:
    if (globalUtilOptind < argc) goto LAB_00291eee;
    Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
    goto LAB_00292166;
  case 0x4c:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_00292166;
    }
    Params.nBddSizeLimit = atoi(argv[globalUtilOptind]);
    iVar1 = Params.nBddSizeLimit;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_00292166;
    }
    Params.fUseBdds = atoi(argv[globalUtilOptind]);
    iVar1 = Params.fUseBdds;
    break;
  case 0x62:
    Params.fUseFraiging = Params.fUseFraiging ^ 1;
    goto LAB_00291c24;
  case 0x66:
    pParams._0_4_ = (uint)pParams ^ 1;
    goto LAB_00291c24;
  case 0x68:
    goto LAB_00292166;
  case 0x72:
    pParams._4_4_ = pParams._4_4_ ^ 1;
    goto LAB_00291c24;
  case 0x76:
    Params.fUseRewriting = Params.fUseRewriting ^ 1;
    goto LAB_00291c24;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if (iVar1 < 0) goto LAB_00292166;
  goto LAB_00291c24;
LAB_00291eee:
  iVar1 = atoi(argv[globalUtilOptind]);
  Params.nTotalBacktrackLimit = (ABC_INT64_T)iVar1;
  globalUtilOptind = globalUtilOptind + 1;
  if (Params.nTotalBacktrackLimit < 0) {
LAB_00292166:
    Abc_Print(-2,"usage: prove [-NCFGLI num] [-rfbvh]\n");
    Abc_Print(-2,"\t         solves combinational miter by rewriting, FRAIGing, and SAT\n");
    Abc_Print(-2,"\t         replaces the current network by the cone modified by rewriting\n");
    Abc_Print(-2,"\t         (there is also newer CEC command \"iprove\")\n");
    Abc_Print(-2,"\t-N num : max number of iterations [default = %d]\n",(ulong)(uint)Params.fUseBdds
             );
    Abc_Print(-2,"\t-C num : max starting number of conflicts in mitering [default = %d]\n",
              (ulong)(uint)Params.fVerbose);
    Abc_Print(-2,"\t-F num : max starting number of conflicts in fraiging [default = %d]\n",
              (ulong)(uint)Params.nRewritingLimitStart);
    Abc_Print(-2,"\t-G num : multiplicative coefficient for fraiging [default = %d]\n",
              (ulong)(uint)(int)Params.nRewritingLimitMulti);
    Abc_Print(-2,"\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n",
              (ulong)(uint)Params.nBddSizeLimit);
    Abc_Print(-2,"\t-I num : max number of clause inspections in all SAT calls [default = %d]\n",
              Params.nTotalBacktrackLimit & 0xffffffff);
    pcVar4 = "no";
    if (pParams._4_4_ != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if ((uint)pParams != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-f     : toggle the use of FRAIGing [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Params.fUseFraiging != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-b     : toggle the use of BDDs [default = %s]\n",pcVar4);
    pcVar4 = "no";
    if (Params.fUseRewriting != 0) {
      pcVar4 = "yes";
    }
    Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    return 1;
  }
  goto LAB_00291c24;
}

Assistant:

int Abc_CommandProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp;
    Prove_Params_t Params, * pParams = &Params;
    int c, RetValue;
    abctime clk;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Prove_ParamsSetDefault( pParams );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFGLIrfbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nItersMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitMulti = (float)atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitMulti < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitLast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitLast < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nTotalInspectLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nTotalInspectLimit < 0 )
                goto usage;
            break;
        case 'r':
            pParams->fUseRewriting ^= 1;
            break;
        case 'f':
            pParams->fUseFraiging ^= 1;
            break;
        case 'b':
            pParams->fUseBdds ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }
    if ( Abc_NtkCoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently can only solve the miter with one output.\n" );
        return 0;
    }
    clk = Abc_Clock();

    if ( Abc_NtkIsStrash(pNtk) )
        pNtkTemp = Abc_NtkDup( pNtk );
    else
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );

    RetValue = Abc_NtkMiterProve( &pNtkTemp, pParams );

    // verify that the pattern is correct
    if ( RetValue == 0 )
    {
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtkTemp->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        ABC_FREE( pSimInfo );
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: prove [-NCFGLI num] [-rfbvh]\n" );
    Abc_Print( -2, "\t         solves combinational miter by rewriting, FRAIGing, and SAT\n" );
    Abc_Print( -2, "\t         replaces the current network by the cone modified by rewriting\n" );
    Abc_Print( -2, "\t         (there is also newer CEC command \"iprove\")\n" );
    Abc_Print( -2, "\t-N num : max number of iterations [default = %d]\n", pParams->nItersMax );
    Abc_Print( -2, "\t-C num : max starting number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitStart );
    Abc_Print( -2, "\t-F num : max starting number of conflicts in fraiging [default = %d]\n", pParams->nFraigingLimitStart );
    Abc_Print( -2, "\t-G num : multiplicative coefficient for fraiging [default = %d]\n", (int)pParams->nFraigingLimitMulti );
    Abc_Print( -2, "\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitLast );
    Abc_Print( -2, "\t-I num : max number of clause inspections in all SAT calls [default = %d]\n", (int)pParams->nTotalInspectLimit );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", pParams->fUseRewriting? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle the use of FRAIGing [default = %s]\n", pParams->fUseFraiging? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle the use of BDDs [default = %s]\n", pParams->fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}